

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::initBasic(Value *this,ValueType type,bool allocated)

{
  *(ushort *)&this->field_0x8 =
       (ushort)allocated << 8 | (ushort)type & 0xff |
       (ushort)*(undefined4 *)&this->field_0x8 & 0xfe00;
  this->comments_ = (CommentInfo *)0x0;
  this->start_ = 0;
  this->limit_ = 0;
  return;
}

Assistant:

void Value::initBasic(ValueType type, bool allocated) {
  type_ = type;
  allocated_ = allocated;
#ifdef JSON_VALUE_USE_INTERNAL_MAP
  itemIsUsed_ = 0;
#endif
  comments_ = 0;
  start_ = 0;
  limit_ = 0;
}